

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitStringTest_random_vector_Test<char32_t>::TestBody
          (WordSplitStringTest_random_vector_Test<char32_t> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c8 [8];
  Message local_c0 [8];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_98 [8];
  vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  split_result;
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_> data;
  WordSplitStringTest_random_vector_Test<char32_t> *this_local;
  
  data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
  RandomWordTestData((RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      *)&split_result.
                         super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,L'\0',0,0);
  jessilib::
  word_split<std::vector,_std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
            ((container_type_conflict12 *)local_98,
             (vector<char32_t,_std::allocator<char32_t>_> *)&data.m_fixed_word_length,L'\0');
  testing::internal::EqHelper::
  Compare<std::vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>,_std::vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>,_nullptr>
            ((EqHelper *)local_b8,"split_result","data.m_tokens",
             (vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
              *)local_98,
             (vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
              *)&data.m_str.super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=(local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::
  vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ::~vector((vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
             *)local_98);
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
  ~RandomWordTestData((RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                       *)&split_result.
                          super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, random_vector) {
	RandomWordTestData<TypeParam, std::vector<TypeParam>> data{};
	std::vector<std::vector<TypeParam>> split_result = word_split<std::vector, std::vector<TypeParam>>(data.m_str, default_delim<TypeParam>);
	EXPECT_EQ(split_result, data.m_tokens);
}